

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

Vec_Ptr_t * Bac_NtkTransformToPtrBox(Bac_Ntk_t *p,int iBox)

{
  Bac_Man_t *pBVar1;
  Mio_Library_t *pLib;
  Bac_ObjType_t BVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  Vec_Ptr_t *p_00;
  int iVar8;
  Bac_Ntk_t *local_50;
  Mio_Gate_t *local_48;
  
  BVar2 = Bac_ObjType(p,iBox);
  pBVar1 = p->pDesign;
  uVar3 = Bac_BoxNtkId(p,iBox);
  if (((int)uVar3 < 1) || (pBVar1->nNtks < (int)uVar3)) {
    local_50 = (Bac_Ntk_t *)0x0;
  }
  else {
    local_50 = pBVar1->pNtks + uVar3;
  }
  pLib = (Mio_Library_t *)p->pDesign->pMioLib;
  if (pLib == (Mio_Library_t *)0x0) {
    local_48 = (Mio_Gate_t *)0x0;
  }
  else {
    pcVar7 = Bac_BoxNtkName(p,iBox);
    local_48 = Mio_LibraryReadGateByName(pLib,pcVar7,(char *)0x0);
  }
  iVar4 = Bac_ObjIsBox(p,iBox);
  if (iVar4 == 0) {
    __assert_fail("Bac_ObjIsBox(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                  ,0x130,"int Bac_BoxBiNum(Bac_Ntk_t *, int)");
  }
  iVar4 = iBox;
  iVar8 = 2;
  do {
    iVar6 = iVar8;
    if (iVar4 < 1) break;
    iVar4 = iVar4 + -1;
    iVar5 = Bac_ObjIsBi(p,iVar4);
    iVar8 = iVar6 + 2;
  } while (iVar5 != 0);
  iVar4 = Bac_ObjIsBox(p,iBox);
  if (iVar4 == 0) {
    __assert_fail("Bac_ObjIsBox(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                  ,0x131,"int Bac_BoxBoNum(Bac_Ntk_t *, int)");
  }
  iVar4 = iBox + 1;
  do {
    iVar8 = iVar6;
    if ((p->vType).nSize <= iVar4) break;
    iVar5 = Bac_ObjIsBo(p,iVar4);
    iVar4 = iVar4 + 1;
    iVar6 = iVar8 + 2;
  } while (iVar5 != 0);
  p_00 = Vec_PtrAllocExact(iVar8);
  pcVar7 = Bac_BoxNtkName(p,iBox);
  Vec_PtrPush(p_00,pcVar7);
  pcVar7 = Bac_ObjNameStr(p,iBox);
  Vec_PtrPush(p_00,pcVar7);
  iVar8 = 0;
  iVar4 = iBox;
  while (0 < iVar4) {
    iVar4 = iVar4 + -1;
    iVar6 = Bac_ObjIsBi(p,iVar4);
    if (iVar6 == 0) break;
    if (BVar2 == BAC_OBJ_BOX) {
      iVar6 = Vec_IntEntry(&local_50->vInputs,iVar8);
      pcVar7 = Bac_ObjNameStr(local_50,iVar6);
    }
    else {
      pcVar7 = Mio_GateReadPinName(local_48,iVar8);
    }
    Vec_PtrPush(p_00,pcVar7);
    pcVar7 = Bac_ObjNameStr(p,iVar4);
    Vec_PtrPush(p_00,pcVar7);
    iVar8 = iVar8 + 1;
  }
  for (iVar4 = 0; iVar8 = iBox + 1 + iVar4, iVar8 < (p->vType).nSize; iVar4 = iVar4 + 1) {
    iVar6 = Bac_ObjIsBo(p,iVar8);
    if (iVar6 == 0) break;
    if (BVar2 == BAC_OBJ_BOX) {
      iVar6 = Vec_IntEntry(&local_50->vOutputs,iVar4);
      pcVar7 = Bac_ObjNameStr(local_50,iVar6);
    }
    else {
      pcVar7 = Mio_GateReadOutName(local_48);
    }
    Vec_PtrPush(p_00,pcVar7);
    pcVar7 = Bac_ObjNameStr(p,iVar8);
    Vec_PtrPush(p_00,pcVar7);
  }
  Ptr_CheckArray(p_00);
  return p_00;
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtrBox( Bac_Ntk_t * p, int iBox )
{
    int i, iTerm, fUser = Bac_ObjIsBoxUser( p, iBox );
    Bac_Ntk_t * pBoxNtk = Bac_BoxNtk( p, iBox );
    Mio_Library_t * pLib = (Mio_Library_t *)p->pDesign->pMioLib;
    Mio_Gate_t * pGate = pLib ? Mio_LibraryReadGateByName( pLib, Bac_BoxNtkName(p, iBox), NULL ) : NULL;
    Vec_Ptr_t * vBox = Vec_PtrAllocExact( 2*Bac_BoxSize(p, iBox) );
    Vec_PtrPush( vBox, Bac_BoxNtkName(p, iBox) );
    Vec_PtrPush( vBox, Bac_ObjNameStr(p, iBox) );
    Bac_BoxForEachBi( p, iBox, iTerm, i )
    {
        Vec_PtrPush( vBox, fUser ? Bac_ObjNameStr(pBoxNtk, Bac_NtkPi(pBoxNtk, i)) : Mio_GateReadPinName(pGate, i) );
        Vec_PtrPush( vBox, Bac_ObjNameStr(p, iTerm) );
    }
    Bac_BoxForEachBo( p, iBox, iTerm, i )
    {
        Vec_PtrPush( vBox, fUser ? Bac_ObjNameStr(pBoxNtk, Bac_NtkPo(pBoxNtk, i)) : Mio_GateReadOutName(pGate) );
        Vec_PtrPush( vBox, Bac_ObjNameStr(p, iTerm) );
    }
    assert( Ptr_CheckArray(vBox) );
    return vBox;
}